

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dired.c
# Opt level: O1

int d_findfile(int f,int n)

{
  int iVar1;
  int iVar2;
  buffer *bp;
  char local_428 [8];
  char fname [1024];
  
  iVar1 = d_makename(curwp->w_dotp,local_428,0x400);
  iVar2 = 0;
  if (iVar1 != 2) {
    if (iVar1 == 1) {
      bp = dired_(local_428);
    }
    else {
      bp = findbuffer(local_428);
    }
    iVar2 = 0;
    if (bp != (buffer *)0x0) {
      curbp = bp;
      iVar1 = showbuffer(bp,curwp,8);
      if ((iVar1 == 1) && (iVar2 = 1, bp->b_fname[0] == '\0')) {
        iVar2 = readin(local_428);
      }
    }
  }
  return iVar2;
}

Assistant:

int
d_findfile(int f, int n)
{
	struct buffer	*bp;
	int		 s;
	char		 fname[NFILEN];

	if ((s = d_makename(curwp->w_dotp, fname, sizeof(fname))) == ABORT)
		return (FALSE);
	if (s == TRUE)
		bp = dired_(fname);
	else
		bp = findbuffer(fname);
	if (bp == NULL)
		return (FALSE);
	curbp = bp;
	if (showbuffer(bp, curwp, WFFULL) != TRUE)
		return (FALSE);
	if (bp->b_fname[0] != 0)
		return (TRUE);
	return (readin(fname));
}